

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.cpp
# Opt level: O2

void __thiscall chrono::ChProximityContainerSPH::RemoveAllProximities(ChProximityContainerSPH *this)

{
  list<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_> *this_00;
  _List_node_base *p_Var1;
  
  this_00 = &this->proximitylist;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 8))();
    }
    p_Var1[1]._M_next = (_List_node_base *)0x0;
  }
  std::__cxx11::list<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>::clear
            (this_00);
  (this->lastproximity)._M_node =
       (this->proximitylist).
       super__List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>._M_impl
       ._M_node.super__List_node_base._M_next;
  this->n_added = 0;
  return;
}

Assistant:

void ChProximityContainerSPH::RemoveAllProximities() {
    std::list<ChProximitySPH*>::iterator iterproximity = proximitylist.begin();
    while (iterproximity != proximitylist.end()) {
        delete (*iterproximity);
        (*iterproximity) = 0;
        ++iterproximity;
        // proximitylist.erase(iterproximity); //no! do later with clear(), all together
    }
    proximitylist.clear();

    lastproximity = proximitylist.begin();
    n_added = 0;
}